

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Initialize(ImGuiContext *context)

{
  ImU32 IVar1;
  ImGuiTextBuffer *this;
  ImGuiSettingsHandler ini_handler;
  value_type local_48;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    this = (ImGuiTextBuffer *)(*GImAllocatorAllocFunc)(0x10,GImAllocatorUserData);
    ImGuiTextBuffer::ImGuiTextBuffer(this);
    context->LogClipboard = this;
    local_48.TypeHash = 0;
    local_48._12_4_ = 0;
    local_48.WriteAllFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
    local_48.UserData = (void *)0x0;
    local_48.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
    local_48.ReadLineFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
    local_48.TypeName = "Window";
    IVar1 = ImHash("Window",0,0);
    local_48.TypeHash = IVar1;
    local_48.ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    local_48.ReadLineFn = SettingsHandlerWindow_ReadLine;
    local_48.WriteAllFn = SettingsHandlerWindow_WriteAll;
    ImVector<ImGuiSettingsHandler>::push_front(&context->SettingsHandlers,&local_48);
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                ,0xe57,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);
    g.LogClipboard = IM_NEW(ImGuiTextBuffer)();

    // Add .ini handle for ImGuiWindow type
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Window";
    ini_handler.TypeHash = ImHash("Window", 0, 0);
    ini_handler.ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    ini_handler.ReadLineFn = SettingsHandlerWindow_ReadLine;
    ini_handler.WriteAllFn = SettingsHandlerWindow_WriteAll;
    g.SettingsHandlers.push_front(ini_handler);

    g.Initialized = true;
}